

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O2

int __thiscall MODEL3D::three_dim_model::import_process_info(three_dim_model *this,string *pif_path)

{
  char cVar1;
  bool bVar2;
  istream *piVar3;
  int iVar4;
  int local_2a4;
  three_dim_model *local_2a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  split_string_vector;
  string file_buffer;
  is_any_ofF<char> local_258;
  fstream geo_file;
  
  local_2a0 = this;
  std::fstream::fstream((string *)&geo_file);
  file_buffer._M_dataplus._M_p = (pointer)&file_buffer.field_2;
  file_buffer._M_string_length = 0;
  file_buffer.field_2._M_local_buf[0] = '\0';
  std::fstream::open((string *)&geo_file,(_Ios_Openmode)pif_path);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    iVar4 = 1;
    while( true ) {
      local_2a4 = iVar4;
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&geo_file,(string *)&file_buffer);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      if (*file_buffer._M_dataplus._M_p != '*') {
        split_string_vector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        split_string_vector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        split_string_vector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        boost::algorithm::is_any_of<char[2]>(&local_258,(char (*) [2])0x15be29);
        boost::algorithm::
        split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
                  (&split_string_vector,&file_buffer,&local_258,token_compress_off);
        boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_258);
        GEO::trim_string_vector(&split_string_vector);
        bVar2 = std::operator==(split_string_vector.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,"$Layer");
        if (bVar2) {
          import_layer_block(local_2a0,&geo_file,&file_buffer,&local_2a4);
          iVar4 = local_2a4;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&split_string_vector);
      }
      iVar4 = iVar4 + 1;
    }
    std::fstream::close();
  }
  std::__cxx11::string::~string((string *)&file_buffer);
  std::fstream::~fstream(&geo_file);
  return 0;
}

Assistant:

int MODEL3D::three_dim_model::import_process_info(const std::string &pif_path)
{
    std::fstream geo_file;
    std::string file_buffer;
    geo_file.open(pif_path, std::ios::in);
    if (geo_file.is_open())
    {
        int line_number =1;
        while (getline(geo_file, file_buffer))
        {
            if (file_buffer[0]!='*')
            {
                std::vector<std::string> split_string_vector;
                boost::split(split_string_vector, file_buffer, boost::is_any_of("="));
                GEO::trim_string_vector(split_string_vector);
                if (*split_string_vector.begin()=="$Layer")
                {
                    import_layer_block(geo_file, file_buffer, line_number);
                }
            }
            line_number++;
        }
        geo_file.close();
    }
    return EXIT_SUCCESS;
}